

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O0

Box * __thiscall amrex::Periodicity::Domain(Periodicity *this)

{
  bool bVar1;
  int iVar2;
  Periodicity *in_RSI;
  Box *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc4;
  int local_1c;
  
  Box::Box((Box *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    bVar1 = isPeriodic(in_RSI,local_1c);
    if (bVar1) {
      Box::setSmall(in_RDI,local_1c,0);
      Box::setBig(in_RDI,local_1c,(in_RSI->period).vect[local_1c] + -1);
    }
    else {
      iVar3 = local_1c;
      iVar2 = std::numeric_limits<int>::min();
      Box::setSmall(in_RDI,iVar3,iVar2);
      iVar3 = local_1c;
      iVar2 = std::numeric_limits<int>::max();
      Box::setBig(in_RDI,iVar3,iVar2 + -1);
    }
  }
  return in_RDI;
}

Assistant:

Box
Periodicity::Domain () const noexcept
{
    Box pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            pdomain.setSmall(i,0);
            pdomain.setBig  (i,period[i]-1);
        } else {
            pdomain.setSmall(i, std::numeric_limits<int>::min());
            pdomain.setBig(i, std::numeric_limits<int>::max()-1); // so that it can be nodalized.
        }
    }
    return pdomain;
}